

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O2

TypedDeleter<LLVMBC::ICmpInst> * __thiscall
LLVMBC::LLVMContext::
construct_trivial<LLVMBC::LLVMContext::TypedDeleter<LLVMBC::ICmpInst>,LLVMBC::ICmpInst*&>
          (LLVMContext *this,ICmpInst **u)

{
  ICmpInst *pIVar1;
  TypedDeleter<LLVMBC::ICmpInst> *pTVar2;
  
  pTVar2 = (TypedDeleter<LLVMBC::ICmpInst> *)allocate(this,0x10,8);
  if (pTVar2 != (TypedDeleter<LLVMBC::ICmpInst> *)0x0) {
    pIVar1 = *u;
    (pTVar2->super_Deleter)._vptr_Deleter = (_func_int **)&PTR__Deleter_001e3600;
    pTVar2->ptr = pIVar1;
    return pTVar2;
  }
  std::terminate();
}

Assistant:

T *construct_trivial(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);
		return t;
	}